

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UStringTrieResult __thiscall
icu_63::UCharsTrie::branchNext(UCharsTrie *this,UChar *pos,int32_t length,int32_t uchar)

{
  char16_t cVar1;
  UStringTrieResult UVar2;
  char16_t *pcVar3;
  uint uVar4;
  int iVar5;
  char16_t *pcVar6;
  
  if (length == 0) {
    length = (int32_t)(ushort)*pos;
    pos = pos + 1;
  }
  uVar4 = length + 1;
  while (pcVar6 = pos, 5 < (int)uVar4) {
    if (uchar < (int)(uint)(ushort)*pcVar6) {
      pos = jumpByDelta(pcVar6 + 1);
      uVar4 = uVar4 >> 1;
    }
    else {
      uVar4 = uVar4 - (uVar4 >> 1);
      pos = pcVar6 + 2;
      if (0xfbff < (ushort)pcVar6[1]) {
        if (pcVar6[1] == L'\xffff') {
          pos = pcVar6 + 4;
        }
        else {
          pos = pcVar6 + 3;
        }
      }
    }
  }
  iVar5 = uVar4 + 1;
  do {
    if ((uint)(ushort)*pcVar6 == uchar) {
      pcVar3 = pcVar6 + 1;
      cVar1 = *pcVar3;
      uVar4 = (uint)(ushort)cVar1;
      if (cVar1 < L'\0') {
        UVar2 = USTRINGTRIE_FINAL_VALUE;
      }
      else {
        if ((ushort)cVar1 < 0x4000) {
          pcVar3 = pcVar6 + 2;
        }
        else if (cVar1 == L'翿') {
          uVar4 = CONCAT22(pcVar6[2],pcVar6[3]);
          pcVar3 = pcVar6 + 4;
        }
        else {
          pcVar3 = pcVar6 + 3;
          uVar4 = (uint)(ushort)cVar1 * 0x10000 + (uint)(ushort)pcVar6[2] + 0xc0000000;
        }
        pcVar3 = pcVar3 + (int)uVar4;
        if ((ushort)*pcVar3 < 0x40) {
          UVar2 = USTRINGTRIE_NO_VALUE;
        }
        else {
          UVar2 = (ushort)*pcVar3 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        }
      }
      this->pos_ = pcVar3;
      return UVar2;
    }
    if ((ushort)(pcVar6[1] & 0x7fffU) < 0x4000) {
      pcVar6 = pcVar6 + 2;
    }
    else if ((pcVar6[1] & 0x7fffU) == 0x7fff) {
      pcVar6 = pcVar6 + 4;
    }
    else {
      pcVar6 = pcVar6 + 3;
    }
    iVar5 = iVar5 + -1;
  } while (2 < iVar5);
  if ((uint)(ushort)*pcVar6 == uchar) {
    this->pos_ = pcVar6 + 1;
    if ((ushort)pcVar6[1] < 0x40) {
      UVar2 = USTRINGTRIE_NO_VALUE;
    }
    else {
      UVar2 = (ushort)pcVar6[1] >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
    }
  }
  else {
    this->pos_ = (char16_t *)0x0;
    UVar2 = USTRINGTRIE_NO_MATCH;
  }
  return UVar2;
}

Assistant:

UStringTrieResult
UCharsTrie::branchNext(const UChar *pos, int32_t length, int32_t uchar) {
    // Branch according to the current unit.
    if(length==0) {
        length=*pos++;
    }
    ++length;
    // The length of the branch is the number of units to select from.
    // The data structure encodes a binary search.
    while(length>kMaxBranchLinearSubNodeLength) {
        if(uchar<*pos++) {
            length>>=1;
            pos=jumpByDelta(pos);
        } else {
            length=length-(length>>1);
            pos=skipDelta(pos);
        }
    }
    // Drop down to linear search for the last few units.
    // length>=2 because the loop body above sees length>kMaxBranchLinearSubNodeLength>=3
    // and divides length by 2.
    do {
        if(uchar==*pos++) {
            UStringTrieResult result;
            int32_t node=*pos;
            if(node&kValueIsFinal) {
                // Leave the final value for getValue() to read.
                result=USTRINGTRIE_FINAL_VALUE;
            } else {
                // Use the non-final value as the jump delta.
                ++pos;
                // int32_t delta=readValue(pos, node);
                int32_t delta;
                if(node<kMinTwoUnitValueLead) {
                    delta=node;
                } else if(node<kThreeUnitValueLead) {
                    delta=((node-kMinTwoUnitValueLead)<<16)|*pos++;
                } else {
                    delta=(pos[0]<<16)|pos[1];
                    pos+=2;
                }
                // end readValue()
                pos+=delta;
                node=*pos;
                result= node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
            }
            pos_=pos;
            return result;
        }
        --length;
        pos=skipValue(pos);
    } while(length>1);
    if(uchar==*pos++) {
        pos_=pos;
        int32_t node=*pos;
        return node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
    } else {
        stop();
        return USTRINGTRIE_NO_MATCH;
    }
}